

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O1

void __thiscall OpenMD::Molecule::addConstraintPair(Molecule *this,ConstraintPair *cp)

{
  pointer *pppCVar1;
  iterator __position;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  _Var2;
  ConstraintPair *local_10;
  
  local_10 = cp;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::ConstraintPair**,std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::ConstraintPair*const>>
                    ((this->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->constraintPairs_).
       super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->constraintPairs_).
        super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>::
      _M_realloc_insert<OpenMD::ConstraintPair*const&>
                ((vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>> *)
                 &this->constraintPairs_,__position,&local_10);
    }
    else {
      *__position._M_current = local_10;
      pppCVar1 = &(this->constraintPairs_).
                  super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
  }
  return;
}

Assistant:

void Molecule::addConstraintPair(ConstraintPair* cp) {
    if (std::find(constraintPairs_.begin(), constraintPairs_.end(), cp) ==
        constraintPairs_.end()) {
      constraintPairs_.push_back(cp);
    }
  }